

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void write_deleted_particles(bool write_p,bool write_ph)

{
  int iVar1;
  size_t __n;
  bool bVar2;
  double dVar3;
  unique_ptr<spatial_region,_std::default_delete<spatial_region>_> uVar4;
  undefined8 uVar5;
  _Ios_Openmode _Var6;
  uint uVar7;
  void *__s;
  long *plVar8;
  long *plVar9;
  ostream *poVar10;
  undefined8 *puVar11;
  long *plVar12;
  double *pdVar13;
  ulong uVar14;
  void *pvVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long *this;
  double dVar19;
  string file_name;
  string file_name_suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  char s_cmr [20];
  ofstream fout_deleted_p;
  ofstream fout_deleted_e;
  ofstream fout_deleted_ph;
  char *local_6c8;
  undefined8 local_6c0;
  char local_6b8 [16];
  string local_6a8;
  undefined1 *local_688 [2];
  undefined1 local_678 [16];
  ios_base *local_668;
  ios_base *local_660;
  ios_base *local_658;
  undefined8 local_650;
  char local_648 [24];
  long *local_630;
  long local_628;
  long local_620;
  long lStack_618;
  ios_base local_538 [264];
  long *local_430;
  long local_428;
  long local_420;
  long lStack_418;
  ios_base local_338 [264];
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  ios_base local_138 [264];
  
  local_6c8 = local_6b8;
  local_6c0 = 0;
  local_6b8[0] = '\0';
  _Var6 = (_S_out|_S_app) - (uint)(mpi_rank == 0);
  OutputIterations::get_current_iteration_string_abi_cxx11_(&local_6a8,&output_iterations);
  iVar1 = neps_ph;
  __n = (long)neps_ph * 8;
  uVar17 = 0xffffffffffffffff;
  if (-1 < (long)neps_ph) {
    uVar17 = __n;
  }
  __s = operator_new__(uVar17);
  if (0 < iVar1) {
    memset(__s,0,__n);
  }
  plVar12 = _VTT;
  if (0 < n_sr) {
    uVar17 = 0;
    local_660 = local_138;
    local_668 = local_538;
    local_658 = local_338;
    local_650 = ___throw_bad_array_new_length;
    do {
      if (uVar17 == (uint)mpi_rank) {
        local_630 = &local_620;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_630,data_folder_abi_cxx11_._M_dataplus._M_p,
                   data_folder_abi_cxx11_._M_dataplus._M_p + data_folder_abi_cxx11_._M_string_length
                  );
        std::__cxx11::string::append((char *)&local_630);
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_630,(ulong)local_6a8._M_dataplus._M_p);
        plVar9 = plVar8 + 2;
        if ((long *)*plVar8 == plVar9) {
          local_420 = *plVar9;
          lStack_418 = plVar8[3];
          local_430 = &local_420;
        }
        else {
          local_420 = *plVar9;
          local_430 = (long *)*plVar8;
        }
        local_428 = plVar8[1];
        *plVar8 = (long)plVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_6c8,(string *)&local_430);
        if (local_430 != &local_420) {
          operator_delete(local_430);
        }
        if (local_630 != &local_620) {
          operator_delete(local_630);
        }
        std::ofstream::ofstream(&local_430,local_6c8,_Var6);
        local_230 = &local_220;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_230,data_folder_abi_cxx11_._M_dataplus._M_p,
                   data_folder_abi_cxx11_._M_dataplus._M_p + data_folder_abi_cxx11_._M_string_length
                  );
        std::__cxx11::string::append((char *)&local_230);
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_230,(ulong)local_6a8._M_dataplus._M_p);
        plVar9 = plVar8 + 2;
        if ((long *)*plVar8 == plVar9) {
          local_620 = *plVar9;
          lStack_618 = plVar8[3];
          local_630 = &local_620;
        }
        else {
          local_620 = *plVar9;
          local_630 = (long *)*plVar8;
        }
        local_628 = plVar8[1];
        *plVar8 = (long)plVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_6c8,(string *)&local_630);
        if (local_630 != &local_620) {
          operator_delete(local_630);
        }
        if (local_230 != &local_220) {
          operator_delete(local_230);
        }
        std::ofstream::ofstream(&local_630,local_6c8,_Var6);
        local_688[0] = local_678;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_688,data_folder_abi_cxx11_._M_dataplus._M_p,
                   data_folder_abi_cxx11_._M_dataplus._M_p + data_folder_abi_cxx11_._M_string_length
                  );
        std::__cxx11::string::append((char *)local_688);
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_688,(ulong)local_6a8._M_dataplus._M_p);
        plVar9 = plVar8 + 2;
        if ((long *)*plVar8 == plVar9) {
          local_220 = *plVar9;
          lStack_218 = plVar8[3];
          local_230 = &local_220;
        }
        else {
          local_220 = *plVar9;
          local_230 = (long *)*plVar8;
        }
        local_228 = plVar8[1];
        *plVar8 = (long)plVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_6c8,(string *)&local_230);
        if (local_230 != &local_220) {
          operator_delete(local_230);
        }
        if (local_688[0] != local_678) {
          operator_delete(local_688[0]);
        }
        std::ofstream::ofstream((string *)&local_230,local_6c8,_Var6);
        iVar1 = n_ion_populations;
        lVar18 = (long)n_ion_populations;
        uVar14 = lVar18 * 0x200 + 8;
        if (lVar18 < 0) {
          uVar14 = 0xffffffffffffffff;
        }
        plVar9 = (long *)operator_new__(uVar14);
        plVar8 = plVar9 + 1;
        *plVar9 = lVar18;
        if (iVar1 != 0) {
          lVar16 = 0;
          this = plVar8;
          do {
            std::ofstream::ofstream(this);
            lVar16 = lVar16 + -0x200;
            this = this + 0x40;
          } while (-lVar16 != lVar18 * 0x200);
          if (0 < n_ion_populations) {
            lVar18 = 0;
            do {
              sprintf(local_648,"%g",icmr[lVar18]);
              local_688[0] = local_678;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_688,data_folder_abi_cxx11_._M_dataplus._M_p,
                         data_folder_abi_cxx11_._M_dataplus._M_p +
                         data_folder_abi_cxx11_._M_string_length);
              std::__cxx11::string::append((char *)local_688);
              std::__cxx11::string::operator=((string *)&local_6c8,(string *)local_688);
              if (local_688[0] != local_678) {
                operator_delete(local_688[0]);
              }
              std::__cxx11::string::append((char *)&local_6c8);
              std::__cxx11::string::append((char *)&local_6c8);
              std::__cxx11::string::_M_append((char *)&local_6c8,(ulong)local_6a8._M_dataplus._M_p);
              std::ofstream::open((char *)plVar8,(_Ios_Openmode)local_6c8);
              lVar18 = lVar18 + 1;
              plVar8 = plVar8 + 0x40;
            } while (lVar18 < n_ion_populations);
          }
        }
        uVar4._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
        super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
        super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
             psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
             _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
             super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl;
        pdVar13 = *(double **)
                   ((long)psr._M_t.
                          super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                          .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x248);
        if (pdVar13 !=
            *(double **)
             ((long)psr._M_t.
                    super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t
                    .super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                    super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x250)) {
          do {
            dVar19 = *pdVar13;
            if ((dVar19 != -1.0) || (NAN(dVar19))) {
              if (dVar19 == 1.0 && write_p) {
                iVar1 = i_particle_p + 1;
                bVar2 = enthp_p <= i_particle_p;
                i_particle_p = iVar1;
                if (bVar2) {
                  i_particle_ph = 0;
                  poVar10 = std::ostream::_M_insert<double>(pdVar13[1]);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  poVar10 = std::ostream::_M_insert<double>
                                      ((((double)x0_sr.super__Vector_base<int,_std::allocator<int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar17] +
                                        pdVar13[2]) * dx) / 6.283185307179586);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  poVar10 = std::ostream::_M_insert<double>((dy * pdVar13[3]) / 6.283185307179586);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  poVar10 = std::ostream::_M_insert<double>((dz * pdVar13[4]) / 6.283185307179586);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  poVar10 = std::ostream::_M_insert<double>(pdVar13[5]);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  poVar10 = std::ostream::_M_insert<double>(pdVar13[6]);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  poVar10 = std::ostream::_M_insert<double>(pdVar13[7]);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  poVar10 = std::ostream::_M_insert<double>(pdVar13[8]);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  poVar10 = std::ostream::_M_insert<double>(pdVar13[9]);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  goto LAB_00116363;
                }
              }
              else if (write_ph && dVar19 == 0.0) {
                uVar7 = (uint)((pdVar13[8] * 0.511) / deps_ph);
                if ((-1 < (int)uVar7) && ((int)uVar7 < neps_ph)) {
                  *(double *)((long)__s + (ulong)uVar7 * 8) =
                       *(double *)((long)__s + (ulong)uVar7 * 8) + pdVar13[1];
                }
                bVar2 = enthp_ph <= i_particle_ph;
                i_particle_ph = i_particle_ph + 1;
                if (bVar2) {
                  i_particle_ph = 0;
                  poVar10 = std::ostream::_M_insert<double>(pdVar13[1]);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  poVar10 = std::ostream::_M_insert<double>
                                      ((((double)x0_sr.super__Vector_base<int,_std::allocator<int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar17] +
                                        pdVar13[2]) * dx) / 6.283185307179586);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  poVar10 = std::ostream::_M_insert<double>((dy * pdVar13[3]) / 6.283185307179586);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  poVar10 = std::ostream::_M_insert<double>((dz * pdVar13[4]) / 6.283185307179586);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  poVar10 = std::ostream::_M_insert<double>(pdVar13[5]);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  poVar10 = std::ostream::_M_insert<double>(pdVar13[6]);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  poVar10 = std::ostream::_M_insert<double>(pdVar13[7]);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  poVar10 = std::ostream::_M_insert<double>(pdVar13[8]);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  std::ostream::put((char)poVar10);
                  std::ostream::flush();
                  poVar10 = std::ostream::_M_insert<double>(pdVar13[9]);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                  goto LAB_00116363;
                }
              }
              else if (0 < (long)n_ion_populations) {
                lVar18 = 0;
                do {
                  if ((dVar19 == icmr[lVar18]) && (!NAN(dVar19) && !NAN(icmr[lVar18]))) {
                    bVar2 = enthp_i <= i_particle_i;
                    i_particle_i = i_particle_i + 1;
                    if (bVar2) {
                      i_particle_i = 0;
                      poVar10 = std::ostream::_M_insert<double>(pdVar13[1]);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) +
                                      (char)poVar10);
                      std::ostream::put((char)poVar10);
                      std::ostream::flush();
                      poVar10 = std::ostream::_M_insert<double>
                                          ((((double)x0_sr.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar17] +
                                            pdVar13[2]) * dx) / 6.283185307179586);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) +
                                      (char)poVar10);
                      std::ostream::put((char)poVar10);
                      std::ostream::flush();
                      poVar10 = std::ostream::_M_insert<double>
                                          ((dy * pdVar13[3]) / 6.283185307179586);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) +
                                      (char)poVar10);
                      std::ostream::put((char)poVar10);
                      std::ostream::flush();
                      poVar10 = std::ostream::_M_insert<double>
                                          ((dz * pdVar13[4]) / 6.283185307179586);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) +
                                      (char)poVar10);
                      std::ostream::put((char)poVar10);
                      std::ostream::flush();
                      poVar10 = std::ostream::_M_insert<double>(pdVar13[5]);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) +
                                      (char)poVar10);
                      std::ostream::put((char)poVar10);
                      std::ostream::flush();
                      poVar10 = std::ostream::_M_insert<double>(pdVar13[6]);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) +
                                      (char)poVar10);
                      std::ostream::put((char)poVar10);
                      std::ostream::flush();
                      poVar10 = std::ostream::_M_insert<double>(pdVar13[7]);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) +
                                      (char)poVar10);
                      std::ostream::put((char)poVar10);
                      std::ostream::flush();
                      poVar10 = std::ostream::_M_insert<double>(pdVar13[8]);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) +
                                      (char)poVar10);
                      std::ostream::put((char)poVar10);
                      std::ostream::flush();
                      poVar10 = std::ostream::_M_insert<double>(pdVar13[9]);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) +
                                      (char)poVar10);
                      std::ostream::put((char)poVar10);
                      std::ostream::flush();
                    }
                    break;
                  }
                  lVar18 = lVar18 + 1;
                } while (n_ion_populations != lVar18);
              }
            }
            else {
              bVar2 = enthp <= i_particle;
              i_particle = i_particle + 1;
              if (bVar2) {
                i_particle = 0;
                poVar10 = std::ostream::_M_insert<double>(pdVar13[1]);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                poVar10 = std::ostream::_M_insert<double>
                                    ((((double)x0_sr.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_start[uVar17] +
                                      pdVar13[2]) * dx) / 6.283185307179586);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                poVar10 = std::ostream::_M_insert<double>((dy * pdVar13[3]) / 6.283185307179586);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                poVar10 = std::ostream::_M_insert<double>((dz * pdVar13[4]) / 6.283185307179586);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                poVar10 = std::ostream::_M_insert<double>(pdVar13[5]);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                poVar10 = std::ostream::_M_insert<double>(pdVar13[6]);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                poVar10 = std::ostream::_M_insert<double>(pdVar13[7]);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                poVar10 = std::ostream::_M_insert<double>(pdVar13[8]);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                poVar10 = std::ostream::_M_insert<double>(pdVar13[9]);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
LAB_00116363:
                std::ostream::put((char)poVar10);
                std::ostream::flush();
              }
            }
            pdVar13 = pdVar13 + 10;
          } while (pdVar13 !=
                   *(double **)
                    ((long)uVar4._M_t.
                           super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                           .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x250));
          if (pdVar13 !=
              *(double **)
               ((long)uVar4._M_t.
                      super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                      .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x248)) {
            *(double **)
             ((long)uVar4._M_t.
                    super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t
                    .super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                    super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x250) =
                 *(double **)
                  ((long)uVar4._M_t.
                         super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                         .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x248);
          }
        }
        std::ofstream::close();
        std::ofstream::close();
        std::ofstream::close();
        if (0 < n_ion_populations) {
          lVar18 = 0;
          do {
            std::ofstream::close();
            lVar18 = lVar18 + 1;
          } while (lVar18 < n_ion_populations);
        }
        uVar5 = local_650;
        lVar18 = *plVar9;
        if (lVar18 != 0) {
          plVar8 = plVar9 + lVar18 * 0x40 + -0x3f;
          lVar18 = lVar18 * -0x200;
          do {
            *plVar8 = (long)plVar12;
            *(undefined8 *)((long)plVar8 + plVar12[-3]) = uVar5;
            std::filebuf::~filebuf((filebuf *)(plVar8 + 1));
            std::ios_base::~ios_base((ios_base *)(plVar8 + 0x1f));
            plVar8 = plVar8 + -0x40;
            lVar18 = lVar18 + 0x200;
          } while (lVar18 != 0);
        }
        operator_delete__(plVar9);
        local_230 = plVar12;
        *(undefined8 *)((long)&local_230 + plVar12[-3]) = uVar5;
        std::filebuf::~filebuf((filebuf *)&local_228);
        std::ios_base::~ios_base(local_660);
        local_630 = plVar12;
        *(undefined8 *)((long)&local_630 + plVar12[-3]) = uVar5;
        std::filebuf::~filebuf((filebuf *)&local_628);
        std::ios_base::~ios_base(local_668);
        local_430 = plVar12;
        *(undefined8 *)((long)&local_430 + plVar12[-3]) = uVar5;
        std::filebuf::~filebuf((filebuf *)&local_428);
        std::ios_base::~ios_base(local_658);
      }
      MPI_Barrier(&ompi_mpi_comm_world);
      uVar17 = uVar17 + 1;
    } while ((long)uVar17 < (long)n_sr);
  }
  if (write_ph) {
    pvVar15 = __s;
    if (mpi_rank == 0) {
      pvVar15 = (void *)0x1;
    }
    MPI_Reduce(pvVar15,__s,neps_ph,&ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
    if (mpi_rank == 0) {
      local_630 = &local_620;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_630,data_folder_abi_cxx11_._M_dataplus._M_p,
                 data_folder_abi_cxx11_._M_dataplus._M_p + data_folder_abi_cxx11_._M_string_length);
      std::__cxx11::string::append((char *)&local_630);
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_630,(ulong)local_6a8._M_dataplus._M_p);
      plVar12 = puVar11 + 2;
      if ((long *)*puVar11 == plVar12) {
        local_420 = *plVar12;
        lStack_418 = puVar11[3];
        local_430 = &local_420;
      }
      else {
        local_420 = *plVar12;
        local_430 = (long *)*puVar11;
      }
      local_428 = puVar11[1];
      *puVar11 = plVar12;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_6c8,(string *)&local_430);
      if (local_430 != &local_420) {
        operator_delete(local_430);
      }
      if (local_630 != &local_620) {
        operator_delete(local_630);
      }
      std::ofstream::ofstream(&local_430,local_6c8,_S_out);
      if (0 < neps_ph) {
        lVar18 = 0;
        dVar19 = ((lambda * 11148500000000.0 * dx * dy * dz) / 248.05021344239853) / deps_ph;
        do {
          dVar3 = dVar19 * *(double *)((long)__s + lVar18 * 8);
          *(double *)((long)__s + lVar18 * 8) = dVar3;
          poVar10 = std::ostream::_M_insert<double>(dVar3);
          local_630 = (long *)CONCAT71(local_630._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_630,1);
          lVar18 = lVar18 + 1;
        } while (lVar18 < neps_ph);
      }
      std::ofstream::close();
      local_430 = _VTT;
      *(undefined8 *)((long)&local_430 + _VTT[-3]) = ___throw_bad_array_new_length;
      std::filebuf::~filebuf((filebuf *)&local_428);
      std::ios_base::~ios_base(local_338);
    }
  }
  operator_delete__(__s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
    operator_delete(local_6a8._M_dataplus._M_p);
  }
  if (local_6c8 != local_6b8) {
    operator_delete(local_6c8);
  }
  return;
}

Assistant:

void write_deleted_particles(bool write_p, bool write_ph)
{
    ios_base::openmode non_binary_mode;
    if (mpi_rank == 0) {
        non_binary_mode = ios_base::out;
    } else {
        non_binary_mode = ios_base::out | ios_base::app;
    }

    std::string file_name;
    std::string file_name_suffix = output_iterations.get_current_iteration_string();
    
    double* spectrum_ph = new double[neps_ph];
    for(int i=0; i<neps_ph; i++) spectrum_ph[i] = 0;
    int i_eps = 0;

    for(int n=0; n<n_sr; n++)
    {
        if (mpi_rank == n) {
            file_name = data_folder + "/deleted" + file_name_suffix;
            ofstream fout_deleted_e(file_name.c_str(), non_binary_mode);

            file_name = data_folder + "/deleted_p" + file_name_suffix;
            ofstream fout_deleted_p(file_name.c_str(), non_binary_mode);

            file_name = data_folder + "/deleted_ph" + file_name_suffix;
            ofstream fout_deleted_ph(file_name.c_str(), non_binary_mode);

            ofstream* fout_deleted_i = new ofstream[n_ion_populations];
            for (int m=0; m<n_ion_populations; ++m)
            {
                char s_cmr[20];
                sprintf(s_cmr,"%g",icmr[m]);
                file_name = data_folder+"/deleted_";
                file_name += s_cmr;
                file_name += "_";
                file_name += file_name_suffix;
                fout_deleted_i[m].open(file_name.c_str(), non_binary_mode);
            }

            vector<spatial_region::deleted_particle>& del_particles = psr->deleted_particles;

            for (auto it = del_particles.begin(); it != del_particles.end(); ++it)
            {
                if ((*it).cmr == -1)
                {
                    i_particle++;
                    if(i_particle > enthp)
                    {
                        i_particle = 0;
                        fout_deleted_e << (*it).q << endl;
                        fout_deleted_e << dx*((*it).x + x0_sr[n])/(2*PI) << endl;
                        fout_deleted_e << dy*((*it).y)/(2*PI) << endl << dz*((*it).z)/(2*PI) << endl;
                        fout_deleted_e << (*it).ux << endl << (*it).uy << endl <<(*it).uz << endl;
                        #ifdef QUILL_NOQED
                        fout_deleted_e << (*it).g << endl << 0.0 << endl;
                        #else
                        fout_deleted_e << (*it).g << endl << (*it).chi << endl;
                        #endif
                    }
                }
                else if (write_p && (*it).cmr == 1)
                {
                    i_particle_p++;
                    if(i_particle_p > enthp_p)
                    {
                        i_particle_ph = 0;
                        fout_deleted_p << (*it).q << endl;
                        fout_deleted_p << dx*((*it).x + x0_sr[n])/(2*PI) << endl;
                        fout_deleted_p << dy*((*it).y)/(2*PI) << endl << dz*((*it).z)/(2*PI) << endl;
                        fout_deleted_p << (*it).ux << endl << (*it).uy << endl <<(*it).uz << endl;
                        #ifdef QUILL_NOQED
                        fout_deleted_p << (*it).g << endl << 0.0 << endl;
                        #else
                        fout_deleted_p << (*it).g << endl << (*it).chi << endl;
                        #endif
                    }
                }
                else if (write_ph && (*it).cmr == 0)
                {
                    i_eps = (*it).g*0.511/deps_ph;
                    if((i_eps > -1) && (i_eps < neps_ph)) {
                        spectrum_ph[i_eps] = spectrum_ph[i_eps] + (*it).q; // q>0 for photons
                    }
                    i_particle_ph++;
                    if(i_particle_ph > enthp_ph)
                    {
                        i_particle_ph = 0;
                        fout_deleted_ph << (*it).q << endl;
                        fout_deleted_ph << dx*((*it).x + x0_sr[n])/(2*PI) << endl;
                        fout_deleted_ph << dy*((*it).y)/(2*PI) << endl << dz*((*it).z)/(2*PI) << endl;
                        fout_deleted_ph << (*it).ux << endl << (*it).uy << endl <<(*it).uz << endl;
                        #ifdef QUILL_NOQED
                        fout_deleted_ph << (*it).g << endl << 0.0 << endl;
                        #else
                        fout_deleted_ph << (*it).g << endl << (*it).chi << endl;
                        #endif
                    }
                }
                else
                {
                    for (int j=0; j<n_ion_populations; ++j)
                    {
                        if ((*it).cmr == icmr[j])
                        {
                            i_particle_i++;
                            if(i_particle_i > enthp_i)
                            {
                                i_particle_i = 0;
                                fout_deleted_i[j] << (*it).q << endl;
                                fout_deleted_i[j] << dx*((*it).x + x0_sr[n])/(2*PI) << endl;
                                fout_deleted_i[j] << dy*((*it).y)/(2*PI) << endl << dz*((*it).z)/(2*PI) << endl;
                                fout_deleted_i[j] << (*it).ux << endl << (*it).uy << endl <<(*it).uz << endl;
                                #ifdef QUILL_NOQED
                                fout_deleted_i[j] << (*it).g << endl << 0.0 << endl;
                                #else
                                fout_deleted_i[j] << (*it).g << endl << (*it).chi << endl;
                                #endif
                            }
                            break;
                        }
                    }
                }
            }
            del_particles.clear();
            fout_deleted_e.close();
            fout_deleted_p.close();
            fout_deleted_ph.close();
            for (int m=0; m<n_ion_populations; ++m)
            {
                fout_deleted_i[m].close();
            }
            delete[] fout_deleted_i;
        }
        MPI_Barrier(MPI_COMM_WORLD);
    }

    if (write_ph) {
        //gathering photon spectra on process rank 0
        if (mpi_rank == 0) {
            MPI_Reduce(MPI_IN_PLACE, spectrum_ph, neps_ph, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
        } else {
            MPI_Reduce(spectrum_ph, spectrum_ph, neps_ph, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
        }

        //spectrum output
        if (mpi_rank == 0) {
            file_name = data_folder + "/spectrum_deleted_ph" + file_name_suffix;
            ofstream fout_spectrum_ph(file_name.c_str());

            double spectrum_norm_ph = 1.11485e13 * lambda*dx*dy*dz/(8*PI*PI*PI)/deps_ph;
            for(int i=0; i<neps_ph; i++)
            {
                spectrum_ph[i] = spectrum_ph[i] * spectrum_norm_ph;
                fout_spectrum_ph << spectrum_ph[i] << '\n';
            }

            fout_spectrum_ph.close();
        }
    }

    delete[] spectrum_ph;
}